

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

int sbit_modify(png_modifier *pm,png_modification *me,int add)

{
  byte bVar1;
  int local_2c;
  int cb;
  png_byte sbit;
  int add_local;
  png_modification *me_local;
  png_modifier *pm_local;
  
  bVar1 = *(byte *)&me[1].next;
  if (bVar1 < pm->bit_depth) {
    local_2c = 0;
    switch(pm->colour_type) {
    case '\0':
      local_2c = 1;
      break;
    default:
      png_error((pm->this).pread,"unexpected colour type in sBIT modification");
      break;
    case '\x02':
    case '\x03':
      local_2c = 3;
      break;
    case '\x04':
      local_2c = 2;
      break;
    case '\x06':
      local_2c = 4;
    }
    png_save_uint_32(pm->buffer,local_2c);
    png_save_uint_32(pm->buffer + 4,0x73424954);
    while (0 < local_2c) {
      local_2c = local_2c + -1;
      pm->buffer[(long)local_2c + 8] = bVar1;
    }
    pm_local._4_4_ = 1;
  }
  else if (add == 0) {
    pm->buffer_position = 0;
    pm->buffer_count = 0;
    pm_local._4_4_ = 1;
  }
  else {
    pm_local._4_4_ = 0;
  }
  return pm_local._4_4_;
}

Assistant:

static int
sbit_modify(png_modifier *pm, png_modification *me, int add)
{
   png_byte sbit = ((sbit_modification*)me)->sbit;
   if (pm->bit_depth > sbit)
   {
      int cb = 0;
      switch (pm->colour_type)
      {
         case 0:
            cb = 1;
            break;

         case 2:
         case 3:
            cb = 3;
            break;

         case 4:
            cb = 2;
            break;

         case 6:
            cb = 4;
            break;

         default:
            png_error(pm->this.pread,
               "unexpected colour type in sBIT modification");
      }

      png_save_uint_32(pm->buffer, cb);
      png_save_uint_32(pm->buffer+4, CHUNK_sBIT);

      while (cb > 0)
         (pm->buffer+8)[--cb] = sbit;

      return 1;
   }
   else if (!add)
   {
      /* Remove the sBIT chunk */
      pm->buffer_count = pm->buffer_position = 0;
      return 1;
   }
   else
      return 0; /* do nothing */
}